

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O2

void __thiscall HelloWorld::Append(HelloWorld *this,string *add)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,(string *)this);
  std::operator<<(poVar1,(string *)add);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void HelloWorld::Append(const std::string &add)
{
    std::stringstream ss;
    ss << m_Message << add;
    m_Message = ss.str();
}